

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

uint dxil_spv::get_geometry_shader_stream_index(MDNode *node)

{
  uint uVar1;
  uint uVar2;
  MDOperand *pMVar3;
  MDNode *this;
  int iVar4;
  uint index;
  
  uVar1 = LLVMBC::MDNode::getNumOperands(node);
  if (10 < uVar1) {
    pMVar3 = LLVMBC::MDNode::getOperand(node,10);
    if (pMVar3->kind != None) {
      pMVar3 = LLVMBC::MDNode::getOperand(node,10);
      this = LLVMBC::dyn_cast<LLVMBC::MDNode>(pMVar3);
      if (this != (MDNode *)0x0) {
        uVar1 = LLVMBC::MDNode::getNumOperands(this);
        iVar4 = (uVar1 >> 1) + 1;
        uVar1 = 0xffffffff;
        while (iVar4 = iVar4 + -1, iVar4 != 0) {
          index = uVar1 + 2;
          uVar2 = get_constant_metadata<unsigned_int>(this,uVar1 + 1);
          uVar1 = index;
          if (uVar2 == 0) {
            uVar1 = get_constant_metadata<unsigned_int>(this,index);
            return uVar1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static unsigned get_geometry_shader_stream_index(const llvm::MDNode *node)
{
	if (node->getNumOperands() >= 11 && node->getOperand(10))
	{
		auto *attr = llvm::dyn_cast<llvm::MDNode>(node->getOperand(10));
		if (!attr)
			return 0;

		unsigned num_pairs = attr->getNumOperands() / 2;
		for (unsigned i = 0; i < num_pairs; i++)
		{
			if (static_cast<DXIL::GSStageOutTags>(get_constant_metadata(attr, 2 * i + 0)) == DXIL::GSStageOutTags::Stream)
				return get_constant_metadata(attr, 2 * i + 1);
		}
	}
	return 0;
}